

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

void ncnn::binary_op_broadcast<ncnn::binary_op_atan2>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  void *pvVar11;
  float fVar12;
  binary_op_atan2 op;
  binary_op_atan2 local_91;
  uint local_90;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  void *local_78;
  Mat *local_70;
  Mat *local_68;
  ulong local_60;
  Mat *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  iVar4 = c->dims;
  local_90 = c->h;
  uVar1 = c->w;
  local_88 = (ulong)(int)uVar1;
  local_8c = c->d;
  local_60 = (ulong)(uint)c->c;
  local_50 = CONCAT44(local_50._4_4_,iVar4);
  local_70 = a;
  local_68 = b;
  local_58 = c;
  if (iVar4 == 2) {
    local_80 = 0;
    local_78 = (void *)0x0;
    if (0 < (int)uVar1) {
      local_78 = (void *)(ulong)uVar1;
    }
    local_48 = 0;
    if (0 < (int)local_90) {
      local_48 = (ulong)local_90;
    }
    for (; local_80 != local_48; local_80 = local_80 + 1) {
      iVar4 = local_70->w;
      iVar2 = local_68->w;
      iVar3 = local_58->w;
      lVar9 = local_58->elemsize * local_80;
      pvVar11 = local_58->data;
      uVar5 = (ulong)(local_68->h + -1);
      if ((long)local_80 < (long)uVar5) {
        uVar5 = local_80;
      }
      pfVar8 = (float *)(uVar5 * local_68->elemsize * (long)iVar2 + (long)local_68->data);
      uVar5 = (ulong)(local_70->h + -1);
      if ((long)local_80 < (long)uVar5) {
        uVar5 = local_80;
      }
      pfVar6 = (float *)(uVar5 * local_70->elemsize * (long)iVar4 + (long)local_70->data);
      for (uVar5 = 0; local_78 != (void *)uVar5; uVar5 = uVar5 + 1) {
        fVar12 = binary_op_atan2::operator()(&local_91,pfVar6,pfVar8);
        *(float *)((long)pvVar11 + uVar5 * 4 + lVar9 * iVar3) = fVar12;
        pfVar8 = pfVar8 + (1 < (long)iVar2);
        pfVar6 = pfVar6 + (1 < (long)iVar4);
      }
    }
  }
  else if (iVar4 == 1) {
    pfVar8 = (float *)a->data;
    pfVar6 = (float *)b->data;
    iVar4 = a->w;
    iVar2 = b->w;
    uVar10 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    local_78 = c->data;
    for (; uVar5 != uVar10; uVar10 = uVar10 + 1) {
      fVar12 = binary_op_atan2::operator()(&local_91,pfVar8,pfVar6);
      *(float *)((long)local_78 + uVar10 * 4) = fVar12;
      pfVar6 = pfVar6 + (1 < iVar2);
      pfVar8 = pfVar8 + (1 < iVar4);
    }
  }
  if ((int)local_50 - 3U < 2) {
    local_40 = 0;
    local_78 = (void *)0x0;
    if (0 < (int)local_88) {
      local_78 = (void *)(local_88 & 0xffffffff);
    }
    if ((int)local_90 < 1) {
      local_90 = 0;
    }
    if ((int)local_8c < 1) {
      local_8c = 0;
    }
    iVar4 = (int)local_60;
    local_60 = local_60 & 0xffffffff;
    if (iVar4 < 1) {
      local_60 = local_40;
    }
    local_88 = local_88 << 2;
    for (; local_40 != local_60; local_40 = local_40 + 1) {
      pvVar11 = (void *)(local_58->cstep * local_40 * local_58->elemsize + (long)local_58->data);
      iVar4 = local_70->w;
      iVar2 = local_68->w;
      for (local_38 = 0; (uint)local_38 != local_8c; local_38 = local_38 + 1) {
        for (local_80 = 0; (uint)local_80 != local_90; local_80 = local_80 + 1) {
          local_48 = (ulong)local_68->w;
          local_50 = (long)local_68->h;
          uVar5 = (ulong)(local_70->c + -1);
          if ((long)local_40 < (long)uVar5) {
            uVar5 = local_40;
          }
          lVar9 = (long)(local_70->h + -1);
          if ((long)local_80 < lVar9) {
            lVar9 = local_80;
          }
          lVar7 = (long)(local_70->d + -1);
          if (local_38 < lVar7) {
            lVar7 = local_38;
          }
          pfVar8 = (float *)(((lVar7 * local_70->h + lVar9) * (long)local_70->w +
                             uVar5 * local_70->cstep) * local_70->elemsize + (long)local_70->data);
          uVar5 = (ulong)(local_68->c + -1);
          if ((long)local_40 < (long)uVar5) {
            uVar5 = local_40;
          }
          lVar9 = (long)(local_68->h + -1);
          if ((long)local_80 < lVar9) {
            lVar9 = local_80;
          }
          lVar7 = (long)(local_68->d + -1);
          if (local_38 < lVar7) {
            lVar7 = local_38;
          }
          pfVar6 = (float *)(((lVar7 * local_50 + lVar9) * local_48 + uVar5 * local_68->cstep) *
                             local_68->elemsize + (long)local_68->data);
          for (uVar5 = 0; local_78 != (void *)uVar5; uVar5 = uVar5 + 1) {
            fVar12 = binary_op_atan2::operator()(&local_91,pfVar8,pfVar6);
            *(float *)((long)pvVar11 + uVar5 * 4) = fVar12;
            pfVar8 = pfVar8 + (1 < iVar4);
            pfVar6 = pfVar6 + (1 < iVar2);
          }
          pvVar11 = (void *)((long)pvVar11 + local_88);
        }
      }
    }
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    // general broadcast
    const Op op;

    const int dims = c.dims;
    const int w = c.w;
    const int h = c.h;
    const int d = c.d;
    const int channels = c.c;

    if (dims == 1)
    {
        const float* ptr = a;
        const float* ptr1 = b;
        float* outptr = c;

        const int ainc = a.w > 1 ? 1 : 0;
        const int binc = b.w > 1 ? 1 : 0;

        for (int x = 0; x < w; x++)
        {
            outptr[x] = op(*ptr, *ptr1);
            ptr += ainc;
            ptr1 += binc;
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(std::min(y, a.h - 1));
            const float* ptr1 = b.row(std::min(y, b.h - 1));
            float* outptr = c.row(y);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(*ptr, *ptr1);
                ptr += ainc;
                ptr1 += binc;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = c.channel(q);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int z = 0; z < d; z++)
            {
                for (int y = 0; y < h; y++)
                {
                    const float* ptr = a.channel(std::min(q, a.c - 1)).depth(std::min(z, a.d - 1)).row(std::min(y, a.h - 1));
                    const float* ptr1 = b.channel(std::min(q, b.c - 1)).depth(std::min(z, b.d - 1)).row(std::min(y, b.h - 1));

                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(*ptr, *ptr1);
                        ptr += ainc;
                        ptr1 += binc;
                    }

                    outptr += w;
                }
            }
        }
    }
}